

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Minisat::ClauseAllocator::reloc(ClauseAllocator *this,CRef *cr,ClauseAllocator *to)

{
  Clause CVar1;
  Clause *from;
  
  from = (Clause *)RegionAllocator<unsigned_int>::operator[](&this->ra,*cr);
  if (((uint)from->header & 0x10) == 0) {
    CVar1.header = (anon_struct_4_5_613047fb_for_header)alloc(to,from);
    *cr = (CRef)CVar1.header;
    *(byte *)&from->header = *(byte *)&from->header | 0x10;
    from[1].header = CVar1.header;
  }
  else {
    *cr = (CRef)from[1].header;
  }
  return;
}

Assistant:

void reloc(CRef& cr, ClauseAllocator& to)
    {
        Clause& c = operator[](cr);
        
        if (c.reloced()) { cr = c.relocation(); return; }
        
        cr = to.alloc(c);
        c.relocate(cr);
    }